

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRConstant * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::
allocate<unsigned_int&,diligent_spirv_cross::SPIRConstant_const*(&)[4],unsigned_int&,bool>
          (ObjectPool<diligent_spirv_cross::SPIRConstant> *this,uint *p,SPIRConstant *(*p_1) [4],
          uint *p_2,bool *p_3)

{
  uint uVar1;
  SPIRConstant *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRConstant **ppSVar4;
  TypeID local_64;
  SPIRConstant *local_60;
  SPIRConstant *ptr;
  uint local_4c;
  SPIRConstant *pSStack_48;
  uint i;
  SPIRConstant *ptr_1;
  bool *pbStack_38;
  uint num_objects;
  bool *p_local_3;
  uint *p_local_2;
  SPIRConstant *(*p_local_1) [4];
  uint *p_local;
  ObjectPool<diligent_spirv_cross::SPIRConstant> *this_local;
  
  pbStack_38 = p_3;
  p_local_3 = (bool *)p_2;
  p_local_2 = (uint *)p_1;
  p_local_1 = (SPIRConstant *(*) [4])p;
  p_local = (uint *)this;
  bVar2 = VectorView<diligent_spirv_cross::SPIRConstant_*>::empty
                    (&(this->vacants).super_VectorView<diligent_spirv_cross::SPIRConstant_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<diligent_spirv_cross::SPIRConstant,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRConstant,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_48 = (SPIRConstant *)malloc((ulong)ptr_1._4_4_ * 0x168);
    if (pSStack_48 == (SPIRConstant *)0x0) {
      return (SPIRConstant *)0x0;
    }
    SmallVector<diligent_spirv_cross::SPIRConstant_*,_0UL>::reserve
              (&this->vacants,(ulong)ptr_1._4_4_);
    for (local_4c = 0; local_4c < ptr_1._4_4_; local_4c = local_4c + 1) {
      ptr = pSStack_48 + local_4c;
      SmallVector<diligent_spirv_cross::SPIRConstant_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRConstant,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>,8ul>
    ::emplace_back<diligent_spirv_cross::SPIRConstant*&>
              ((SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRConstant,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRConstant>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffb8);
  }
  ppSVar4 = VectorView<diligent_spirv_cross::SPIRConstant_*>::back
                      (&(this->vacants).super_VectorView<diligent_spirv_cross::SPIRConstant_*>);
  local_60 = *ppSVar4;
  SmallVector<diligent_spirv_cross::SPIRConstant_*,_0UL>::pop_back(&this->vacants);
  this_00 = local_60;
  TypedID<(diligent_spirv_cross::Types)1>::TypedID(&local_64,*(uint32_t *)*p_local_1);
  SPIRConstant::SPIRConstant
            (this_00,local_64,(SPIRConstant **)p_local_2,*(uint32_t *)p_local_3,
             (bool)(*pbStack_38 & 1));
  return local_60;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}